

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_extract(lua_State *L)

{
  lua_Unsigned lVar1;
  int iVar2;
  undefined8 in_RAX;
  int w;
  
  w._0_1_ = (char)((ulong)in_RAX >> 0x20);
  lVar1 = luaL_checkunsigned(L,1);
  iVar2 = fieldargs(L,2,&w);
  lua_pushunsigned(L,~(-2 << ((char)w - 1U & 0x1f)) & lVar1 >> ((byte)iVar2 & 0x1f));
  return 1;
}

Assistant:

static int b_extract (lua_State *L) {
  int w;
  b_uint r = luaL_checkunsigned(L, 1);
  int f = fieldargs(L, 2, &w);
  r = (r >> f) & mask(w);
  lua_pushunsigned(L, r);
  return 1;
}